

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_algorithms_tests.hpp
# Opt level: O3

void test_parallel_for(void)

{
  task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  *ptVar1;
  uint64_t uid;
  bool bVar2;
  uint __val;
  undefined4 uVar3;
  int __val_00;
  undefined8 uVar4;
  undefined8 this;
  long lVar5;
  uint uVar6;
  undefined8 *puVar7;
  long *plVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  timing_registry *this_00;
  uint uVar10;
  element_type *peVar11;
  _func_int ***ppp_Var12;
  ulong uVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _func_int **pp_Var14;
  int iVar15;
  uint uVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  test __t;
  uint __uval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  string __str_3;
  string __str_2;
  test local_155;
  uint local_154;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  _func_int ***local_148;
  long local_140;
  _func_int **local_138;
  long lStack_130;
  undefined1 local_128 [32];
  element_type *local_108;
  long local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [40];
  _Elt_pointer *local_90 [2];
  _Elt_pointer local_80 [2];
  task_handle *local_70;
  _Map_pointer local_68;
  task_handle local_60;
  task_handle local_50 [2];
  
  test::test(&local_155,"test_parallel_for");
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"FibonacciParallelFor","");
  uVar3 = oqpi::
          helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
          ::scheduler_._32_4_;
  __val_00 = gTaskCount;
  __val = oqpi::
          helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
          ::scheduler_._32_4_;
  if (gTaskCount <
      (int)oqpi::
           helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
           ::scheduler_._32_4_) {
    __val = gTaskCount;
  }
  if (gTaskCount <
      (int)oqpi::
           helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
           ::scheduler_._32_4_) {
    iVar15 = 0;
    uVar16 = 1;
  }
  else {
    uVar16 = gTaskCount / (int)__val;
    iVar15 = gTaskCount % (int)__val;
  }
  if (gTaskCount < 1) goto LAB_0016b761;
  local_148 = &local_138;
  local_154 = uVar16;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,local_70,(long)local_68 + (long)local_70);
  std::__cxx11::string::append((char *)&local_148);
  uVar16 = 1;
  if (9 < (uint)__val_00) {
    uVar10 = __val_00;
    uVar6 = 4;
    do {
      uVar16 = uVar6;
      if (uVar10 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_0016b00f;
      }
      if (uVar10 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_0016b00f;
      }
      if (uVar10 < 10000) goto LAB_0016b00f;
      bVar2 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      uVar6 = uVar16 + 4;
    } while (bVar2);
    uVar16 = uVar16 + 1;
  }
LAB_0016b00f:
  local_108 = (element_type *)local_f8;
  std::__cxx11::string::_M_construct((ulong)&local_108,(char)uVar16);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_108,uVar16,__val_00);
  pp_Var14 = (_func_int **)0xf;
  if (local_148 != &local_138) {
    pp_Var14 = local_138;
  }
  if (pp_Var14 < (_func_int **)(local_100 + local_140)) {
    pp_Var14 = (_func_int **)0xf;
    if (local_108 != (element_type *)local_f8) {
      pp_Var14 = (_func_int **)local_f8._0_8_;
    }
    if (pp_Var14 < (_func_int **)(local_100 + local_140)) goto LAB_0016b083;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_148);
  }
  else {
LAB_0016b083:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_108);
  }
  local_128._0_8_ = local_128 + 0x10;
  plVar8 = puVar7 + 2;
  if ((long *)*puVar7 == plVar8) {
    local_128._16_8_ = *plVar8;
    local_128._24_8_ = puVar7[3];
  }
  else {
    local_128._16_8_ = *plVar8;
    local_128._0_8_ = (long *)*puVar7;
  }
  local_128._8_8_ = puVar7[1];
  *puVar7 = plVar8;
  puVar7[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_128);
  local_e8._0_8_ = local_e8 + 0x10;
  peVar11 = (element_type *)(plVar8 + 2);
  if ((element_type *)*plVar8 == peVar11) {
    local_d8._0_8_ = (peVar11->super_task_base)._vptr_task_base;
    local_d8._8_8_ = plVar8[3];
  }
  else {
    local_d8._0_8_ = (peVar11->super_task_base)._vptr_task_base;
    local_e8._0_8_ = (element_type *)*plVar8;
  }
  local_e8._8_8_ = plVar8[1];
  *plVar8 = (long)peVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if (local_108 != (element_type *)local_f8) {
    operator_delete(local_108,local_f8._0_8_ + 1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,(long)local_138 + 1);
  }
  local_90[0] = (_Elt_pointer *)CONCAT71(local_90[0]._1_7_,2);
  local_128._0_4_ = __val;
  local_148 = (_func_int ***)((ulong)local_148 & 0xffffffff00000000);
  std::
  __shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>>,oqpi::scheduler<concurrent_queue>&,std::__cxx11::string_const&,oqpi::task_priority&,int&,int&>
            ((__shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,(__gnu_cxx::_Lock_policy)2>
              *)(local_b8 + 0x10),
             (allocator<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
              *)&local_108,
             (scheduler<concurrent_queue> *)
             oqpi::
             helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
             ::scheduler_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
             (task_priority *)local_90,(int *)local_128,(int *)&local_148);
  local_150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  local_150->_M_use_count = 1;
  local_150->_M_weak_count = 1;
  local_150->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f8e10;
  uVar13 = 0;
  *(undefined4 *)&local_150[1]._vptr__Sp_counted_base = 0;
  *(int *)((long)&local_150[1]._vptr__Sp_counted_base + 4) = __val_00;
  local_150[1]._M_use_count = __val_00;
  local_150[1]._M_weak_count = __val;
  *(uint *)&local_150[2]._vptr__Sp_counted_base = local_154;
  *(int *)((long)&local_150[2]._vptr__Sp_counted_base + 4) = iVar15;
  local_150[2]._M_use_count = 0;
  if (0 < (int)uVar3) {
    local_50[1].spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(local_150 + 1);
    do {
      local_154 = (uint)uVar13 + 1;
      uVar16 = 1;
      if (8 < (uint)uVar13) {
        uVar10 = local_154;
        uVar6 = 4;
        do {
          uVar16 = uVar6;
          if (uVar10 < 100) {
            uVar16 = uVar16 - 2;
            goto LAB_0016b299;
          }
          if (uVar10 < 1000) {
            uVar16 = uVar16 - 1;
            goto LAB_0016b299;
          }
          if (uVar10 < 10000) goto LAB_0016b299;
          bVar2 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          uVar6 = uVar16 + 4;
        } while (bVar2);
        uVar16 = uVar16 + 1;
      }
LAB_0016b299:
      local_90[0] = local_80;
      local_50[1].spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar13;
      std::__cxx11::string::_M_construct((ulong)local_90,(char)uVar16);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_90[0],uVar16,local_154);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x1c889b);
      peVar11 = (element_type *)(plVar8 + 2);
      if ((element_type *)*plVar8 == peVar11) {
        local_f8._0_8_ = (peVar11->super_task_base)._vptr_task_base;
        local_f8._8_8_ = plVar8[3];
        local_108 = (element_type *)local_f8;
      }
      else {
        local_f8._0_8_ = (peVar11->super_task_base)._vptr_task_base;
        local_108 = (element_type *)*plVar8;
      }
      local_100 = plVar8[1];
      *plVar8 = (long)peVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
      local_148 = &local_138;
      ppp_Var12 = (_func_int ***)(plVar8 + 2);
      if ((_func_int ***)*plVar8 == ppp_Var12) {
        local_138 = *ppp_Var12;
        lStack_130 = plVar8[3];
      }
      else {
        local_138 = *ppp_Var12;
        local_148 = (_func_int ***)*plVar8;
      }
      local_140 = plVar8[1];
      *plVar8 = (long)ppp_Var12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      uVar16 = 1;
      if (9 < __val) {
        uVar13 = (ulong)__val;
        uVar10 = 4;
        do {
          uVar16 = uVar10;
          uVar6 = (uint)uVar13;
          if (uVar6 < 100) {
            uVar16 = uVar16 - 2;
            goto LAB_0016b3d7;
          }
          if (uVar6 < 1000) {
            uVar16 = uVar16 - 1;
            goto LAB_0016b3d7;
          }
          if (uVar6 < 10000) goto LAB_0016b3d7;
          uVar13 = uVar13 / 10000;
          uVar10 = uVar16 + 4;
        } while (99999 < uVar6);
        uVar16 = uVar16 + 1;
      }
LAB_0016b3d7:
      local_d8._16_8_ = local_b8;
      std::__cxx11::string::_M_construct((ulong)(local_d8 + 0x10),(char)uVar16);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d8._16_8_,uVar16,__val);
      pp_Var14 = (_func_int **)0xf;
      if (local_148 != &local_138) {
        pp_Var14 = local_138;
      }
      if (pp_Var14 < (_func_int **)(local_d8._24_8_ + local_140)) {
        pp_Var14 = (_func_int **)0xf;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8) {
          pp_Var14 = (_func_int **)local_b8._0_8_;
        }
        if (pp_Var14 < (_func_int **)(local_d8._24_8_ + local_140)) goto LAB_0016b462;
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)(local_d8 + 0x10),0,(char *)0x0,(ulong)local_148);
      }
      else {
LAB_0016b462:
        plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_148,local_d8._16_8_);
      }
      local_128._0_8_ = local_128 + 0x10;
      ptVar1 = (task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                *)(plVar8 + 2);
      if ((task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *)*plVar8 == ptVar1) {
        local_128._16_8_ = (ptVar1->super_task_group_base).super_task_base._vptr_task_base;
        local_128._24_8_ = plVar8[3];
      }
      else {
        local_128._16_8_ = (ptVar1->super_task_group_base).super_task_base._vptr_task_base;
        local_128._0_8_ =
             (task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              *)*plVar8;
      }
      local_128._8_8_ = plVar8[1];
      *plVar8 = (long)ptVar1;
      plVar8[1] = 0;
      *(undefined1 *)&(ptVar1->super_task_group_base).super_task_base._vptr_task_base = 0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8) {
        operator_delete((void *)local_d8._16_8_,local_b8._0_8_ + 1);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148,(long)local_138 + 1);
      }
      if (local_108 != (element_type *)local_f8) {
        operator_delete(local_108,local_f8._0_8_ + 1);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],
                        (ulong)((long)&(local_80[0]->spTask_).
                                       super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + 1));
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_150->_M_use_count = local_150->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_150->_M_use_count = local_150->_M_use_count + 1;
      }
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
      p_Var9->_M_use_count = 1;
      p_Var9->_M_weak_count = 1;
      p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f83a8;
      p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_base_001f8180;
      LOCK();
      UNLOCK();
      uVar3 = oqpi::task_base::uid_provider()::uid_generator._4_4_;
      lVar5 = oqpi::task_base::uid_provider()::uid_generator + 1;
      p_Var9[1]._M_use_count = (undefined4)oqpi::task_base::uid_provider()::uid_generator;
      oqpi::task_base::uid_provider()::uid_generator = lVar5;
      p_Var9[1]._M_weak_count = uVar3;
      p_Var9[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var9[2]._M_use_count = 0;
      p_Var9[2]._M_weak_count = 0;
      *(undefined2 *)&p_Var9[3]._vptr__Sp_counted_base = 2;
      *(undefined1 *)((long)&p_Var9[3]._vptr__Sp_counted_base + 2) = 0;
      p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_001f83f8;
      *(element_type **)&p_Var9[3]._M_use_count = (element_type *)(p_Var9 + 1);
      this_00 = timing_registry::get();
      uid._0_4_ = p_Var9[1]._M_use_count;
      uid._4_4_ = p_Var9[1]._M_weak_count;
      timing_registry::registerTask(this_00,uid,(string *)local_128);
      p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_001f83f8;
      *(int *)&p_Var9[4]._vptr__Sp_counted_base =
           (int)local_50[1].spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      *(element_type **)&p_Var9[4]._M_use_count =
           local_50[1].spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      p_Var9[5]._vptr__Sp_counted_base = (_func_int **)local_150;
      local_50[0].spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(p_Var9 + 1);
      local_50[0].spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var9;
      oqpi::
      task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
      ::addTask((task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                 *)local_b8._16_8_,local_50);
      if (local_50[0].spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50[0].spTask_.
                   super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  );
      }
      if ((task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *)local_128._0_8_ !=
          (task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *)(local_128 + 0x10)) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
      }
      uVar13 = (ulong)local_154;
    } while (local_154 != __val);
  }
  this = local_b8._24_8_;
  uVar4 = local_b8._16_8_;
  local_b8._16_8_ =
       (task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
        *)0x0;
  local_b8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._24_8_);
  }
  if ((element_type *)local_e8._0_8_ != (element_type *)(local_e8 + 0x10)) {
    operator_delete((void *)local_e8._0_8_,local_d8._0_8_ + 1);
  }
  if ((task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
       *)uVar4 !=
      (task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
       *)0x0) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(this + 8) = *(int *)(this + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(this + 8) = *(int *)(this + 8) + 1;
      }
    }
    local_128._0_8_ = uVar4;
    local_128._8_8_ = this;
    oqpi::scheduler<concurrent_queue>::add
              ((scheduler<concurrent_queue> *)local_e8,
               (task_handle *)
               oqpi::
               helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
               ::scheduler_);
    oqpi::task_handle::validate((task_handle *)local_e8);
    (**(code **)(*(long *)local_e8._0_8_ + 0x28))();
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
  }
LAB_0016b761:
  if (local_70 != &local_60) {
    operator_delete(local_70,(ulong)((long)&(local_60.spTask_.
                                             super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->_vptr_task_base + 1));
  }
  test::~test(&local_155);
  return;
}

Assistant:

void test_parallel_for()
{
    TEST_FUNC;

    oqpi_tk::parallel_for("FibonacciParallelFor", gTaskCount, [](int32_t i)
    {
        volatile auto a = 0ull;
        a += fibonacci(gValue + a);
        a += i;
    });
}